

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::Disconnect(RWSocket *this)

{
  Event *pEVar1;
  shared_ptr<cppnet::EventActions> actions;
  __shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->_event == (Event *)0x0) {
    pEVar1 = AlloterWrap::PoolNew<cppnet::Event>
                       ((this->_alloter).
                        super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this->_event = pEVar1;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    local_38._M_ptr = (element_type *)local_48._M_ptr;
    local_38._M_refcount._M_pi = local_48._M_refcount._M_pi;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)&pEVar1->_socket,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&(this->super_Socket)._event_actions);
  if ((element_type *)local_48._M_ptr != (element_type *)0x0) {
    (*(local_48._M_ptr)->_vptr_EventActions[8])(local_48._M_ptr,this->_event);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

void RWSocket::Disconnect() {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    auto actions = GetEventActions();
    if (actions) {
        actions->AddDisconnection(_event);
    }
}